

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O1

void __thiscall
XPMP2::SoundWAV::SoundWAV
          (SoundWAV *this,SoundSystem *_pSndSys,string *_filePath,bool _bLoop,float _coneDir,
          float _conePitch,float _coneInAngle,float _coneOutAngle,float _coneOutVol)

{
  pointer pcVar1;
  
  (this->super_SoundFile)._vptr_SoundFile = (_func_int **)&PTR__SoundFile_002e07c8;
  (this->super_SoundFile).pSndSys = _pSndSys;
  (this->super_SoundFile).filePath._M_dataplus._M_p =
       (pointer)&(this->super_SoundFile).filePath.field_2;
  pcVar1 = (_filePath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SoundFile).filePath,pcVar1,pcVar1 + _filePath->_M_string_length
            );
  (this->super_SoundFile).bLoop = _bLoop;
  (this->super_SoundFile).coneDir = _coneDir;
  (this->super_SoundFile).conePitch = _conePitch;
  (this->super_SoundFile).coneInAngle = _coneInAngle;
  (this->super_SoundFile).coneOutAngle = _coneOutAngle;
  (this->super_SoundFile).coneOutVol = _coneOutVol;
  (this->super_SoundFile)._vptr_SoundFile = (_func_int **)&PTR__SoundWAV_002e07f0;
  this->pBuf = (int16_t *)0x0;
  this->bufferSize = 0;
  this->freqHz = 0;
  this->numChannels = 0;
  WavRead(this);
  return;
}

Assistant:

SoundWAV::SoundWAV (SoundSystem* _pSndSys,
                    const std::string& _filePath, bool _bLoop,
                    float _coneDir, float _conePitch,
                    float _coneInAngle, float _coneOutAngle, float _coneOutVol) :
SoundFile(_pSndSys, _filePath, _bLoop, _coneDir, _conePitch,
          _coneInAngle, _coneOutAngle, _coneOutVol)
{
    // Directly try to read the WAV file, will throw exceptions if it doesn't work
    WavRead();
}